

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program.hpp
# Opt level: O3

void __thiscall
ProgramContext::error<SyntaxTree,char_const*&,unsigned_long&>
          (ProgramContext *this,SyntaxTree *context,char *msg,char **args,unsigned_long *args_1)

{
  atomic<unsigned_int> *paVar1;
  __int_type _Var2;
  string local_30;
  
  if (this->logstream != (FILE *)0x0) {
    format_error<char_const*&,unsigned_long&>(&local_30,&this->opt,"error",context,msg,args,args_1);
    fprintf((FILE *)this->logstream,"%s\n",local_30._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  LOCK();
  paVar1 = &this->error_count;
  _Var2 = (paVar1->super___atomic_base<unsigned_int>)._M_i;
  (paVar1->super___atomic_base<unsigned_int>)._M_i =
       (paVar1->super___atomic_base<unsigned_int>)._M_i + 1;
  UNLOCK();
  if (_Var2 + 1 < this->max_error) {
    return;
  }
  fatal_error<tag_nocontext_t>(this,(tag_nocontext_t *)&nocontext,"too many errors");
}

Assistant:

void error(const Context& context, const char* msg, Args&&... args)
    {
        if(logstream) this->puts(format_error(this->opt, "error", context, msg, std::forward<Args>(args)...));

        if(++error_count >= max_error)
            this->fatal_error(nocontext, "too many errors");
    }